

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void __thiscall
duckdb::WindowQuantileState<signed_char>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *this_00;
  bool bVar1;
  char *pcVar2;
  idx_t local_40;
  idx_t local_38;
  char local_30;
  
  while (begin < end) {
    local_40 = begin;
    bVar1 = QuantileIncluded<signed_char>::operator()(this->included,&local_40);
    if (bVar1) {
      this_00 = this->skip;
      pcVar2 = QuantileCursor<signed_char>::operator[](this->data,local_40);
      local_38 = local_40;
      local_30 = *pcVar2;
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
      ::remove(this_00,(char *)&local_38);
    }
    begin = local_40 + 1;
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}